

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O0

void __thiscall
rest_rpc::rpc_service::connection::publish(connection *this,string *key,string *data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  result_code in_stack_0000000e;
  request_type in_stack_0000004f;
  string result;
  uint64_t in_stack_00000058;
  connection *in_stack_00000060;
  string local_58 [32];
  string local_38 [48];
  
  msgpack_codec::
  pack_args_str<rest_rpc::result_code,std::__cxx11::string_const&,std::__cxx11::string_const&,void>
            (in_stack_0000000e,unaff_retaddr,in_RDI);
  std::__cxx11::string::string(local_58,local_38);
  response(in_stack_00000060,in_stack_00000058,_result,in_stack_0000004f);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void publish(const std::string &key, const std::string &data) {
    auto result = msgpack_codec::pack_args_str(result_code::OK, key, data);
    response(0, std::move(result), request_type::sub_pub);
  }